

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O0

Aig_Man_t * Ssw_SignalCorrespondenceRefine(Ssw_Man_t *p)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  abctime aVar7;
  Ssw_Sat_t *pSVar8;
  abctime aVar9;
  Aig_Obj_t *pAVar10;
  abctime aVar11;
  Aig_Man_t *pAVar12;
  bool bVar13;
  Aig_Man_t *pSRed;
  abctime clkTotal;
  abctime clk;
  int nIter;
  int RetValue;
  Aig_Man_t *pAigNew;
  int local_28;
  int nUniques;
  int nSatFailsReal;
  int nRecycles;
  int nSatCallsSat;
  int nSatProof;
  Ssw_Man_t *p_local;
  
  clk._0_4_ = 0xffffffff;
  aVar7 = Abc_Clock();
  iVar2 = Ssw_ClassesLitNum(p->ppClasses);
  p->nLitsBeg = iVar2;
  iVar2 = Aig_ManNodeNum(p->pAig);
  p->nNodesBeg = iVar2;
  iVar2 = Aig_ManRegNum(p->pAig);
  p->nRegsBeg = iVar2;
  if (p->pPars->fVerbose != 0) {
    Abc_Print(1,"Before BMC: ");
    Ssw_ClassesPrint(p->ppClasses,0);
  }
  if (p->pPars->fLatchCorr == 0) {
    pSVar8 = Ssw_SatStart(0);
    p->pMSat = pSVar8;
    if (p->pPars->fConstrs == 0) {
      Ssw_ManSweepBmc(p);
    }
    else {
      Ssw_ManSweepBmcConstr(p);
    }
    Ssw_SatStop(p->pMSat);
    p->pMSat = (Ssw_Sat_t *)0x0;
    Ssw_ManCleanup(p);
  }
  if (p->pPars->fVerbose != 0) {
    Abc_Print(1,"After  BMC: ");
    Ssw_ClassesPrint(p->ppClasses,0);
  }
  if (p->pPars->pFunc != (void *)0x0) {
    (*(code *)p->pPars->pFunc)(p->pPars->pData);
    (*(code *)p->pPars->pFunc)();
  }
  if (p->pPars->nStepsMax == 0) {
    Abc_Print(1,"Stopped signal correspondence after BMC.\n");
  }
  else {
    local_28 = 0;
    nUniques = 0;
    nSatFailsReal = 0;
    nRecycles = 0;
    for (clk._0_4_ = 0; p->pPars->nStepsMax != (uint)clk; clk._0_4_ = (uint)clk + 1) {
      if ((-1 < p->pPars->nItersStop) && (p->pPars->nItersStop == (uint)clk)) {
        pAVar12 = Ssw_SpeculativeReduction(p);
        Aig_ManDumpBlif(pAVar12,"srm.blif",(Vec_Ptr_t *)0x0,(Vec_Ptr_t *)0x0);
        Aig_ManStop(pAVar12);
        Abc_Print(1,"Iterative refinement is stopped before iteration %d.\n",(ulong)(uint)clk);
        Abc_Print(1,"The network is reduced using candidate equivalences.\n");
        Abc_Print(1,"Speculatively reduced miter is saved in file \"%s\".\n","srm.blif");
        Abc_Print(1,"If the miter is SAT, the reduced result is incorrect.\n");
        goto LAB_007fdf98;
      }
      aVar11 = Abc_Clock();
      pSVar8 = Ssw_SatStart(0);
      p->pMSat = pSVar8;
      if (p->pPars->fLatchCorrOpt == 0) {
        if (p->pPars->fConstrs == 0) {
          if (p->pPars->fDynamic == 0) {
            clk._4_4_ = Ssw_ManSweep(p);
          }
          else {
            clk._4_4_ = Ssw_ManSweepDyn(p);
          }
        }
        else {
          clk._4_4_ = Ssw_ManSweepConstr(p);
        }
        p->pPars->nConflicts = p->pPars->nConflicts + (int)(p->pMSat->pSat->stats).conflicts;
        if (p->pPars->fVerbose != 0) {
          uVar4 = Ssw_ClassesCand1Num(p->ppClasses);
          uVar5 = Ssw_ClassesClassNum(p->ppClasses);
          uVar3 = p->nConstrReduced;
          iVar2 = Aig_ManNodeNum(p->pFrames);
          Abc_Print(1,"%3d : C =%7d. Cl =%7d. LR =%6d. NR =%6d. ",(ulong)(uint)clk,(ulong)uVar4,
                    (ulong)uVar5,(ulong)uVar3,iVar2);
          if (p->pPars->fDynamic != 0) {
            Abc_Print(1,"Cex =%5d. ",(ulong)(uint)(p->nSatCallsSat - nSatFailsReal));
            Abc_Print(1,"R =%4d. ",(ulong)(uint)(p->nRecycles - nUniques));
          }
          iVar2 = p->nSatFailsReal;
          iVar6 = Saig_ManPoNum(p->pAig);
          bVar13 = false;
          if (iVar6 == 1) {
            pAVar12 = p->pAig;
            pAVar10 = Aig_ManCo(p->pAig,0);
            pAVar10 = Aig_ObjFanin0(pAVar10);
            iVar6 = Ssw_ObjIsConst1Cand(pAVar12,pAVar10);
            bVar13 = iVar6 != 0;
          }
          pcVar1 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
          if (bVar13) {
            pcVar1 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
          }
          Abc_Print(1,"F =%5d. %s ",(ulong)(uint)(iVar2 - local_28),pcVar1 + 0x4a);
          Abc_Print(1,"%s =","T");
          aVar9 = Abc_Clock();
          Abc_Print(1,"%9.2f sec\n",((double)(aVar9 - aVar11) * 1.0) / 1000000.0);
        }
        if ((p->pPars->fStopWhenGone != 0) && (iVar2 = Saig_ManPoNum(p->pAig), iVar2 == 1)) {
          pAVar12 = p->pAig;
          pAVar10 = Aig_ManCo(p->pAig,0);
          pAVar10 = Aig_ObjFanin0(pAVar10);
          iVar2 = Ssw_ObjIsConst1Cand(pAVar12,pAVar10);
          if (iVar2 == 0) {
            printf("Iterative refinement is stopped after iteration %d\n",(ulong)(uint)clk);
            printf("because the property output is no longer a candidate constant.\n");
            p->nLitsEnd = p->nLitsBeg;
            p->nNodesEnd = p->nNodesBeg;
            p->nRegsEnd = p->nRegsBeg;
            Ssw_SatStop(p->pMSat);
            p->pMSat = (Ssw_Sat_t *)0x0;
            Ssw_ManCleanup(p);
            Aig_ManSetPhase(p->pAig);
            Aig_ManCleanMarkB(p->pAig);
            pAVar12 = Aig_ManDupSimple(p->pAig);
            return pAVar12;
          }
        }
      }
      else {
        clk._4_4_ = Ssw_ManSweepLatch(p);
        if (p->pPars->fVerbose != 0) {
          uVar3 = Ssw_ClassesCand1Num(p->ppClasses);
          uVar4 = Ssw_ClassesClassNum(p->ppClasses);
          Abc_Print(1,"%3d : C =%7d. Cl =%7d. Pr =%6d. Cex =%5d. R =%4d. F =%4d. ",(ulong)(uint)clk,
                    (ulong)uVar3,(ulong)uVar4,(ulong)(uint)(p->nSatProof - nRecycles),
                    p->nSatCallsSat - nSatFailsReal,p->nRecycles - nUniques,
                    p->nSatFailsReal - local_28);
          Abc_Print(1,"%s =","T");
          aVar9 = Abc_Clock();
          Abc_Print(1,"%9.2f sec\n",((double)(aVar9 - aVar11) * 1.0) / 1000000.0);
        }
      }
      nRecycles = p->nSatProof;
      nSatFailsReal = p->nSatCallsSat;
      nUniques = p->nRecycles;
      local_28 = p->nSatFailsReal;
      iVar2 = Abc_MaxInt(p->nVarsMax,p->pMSat->nSatVars);
      p->nVarsMax = iVar2;
      iVar2 = Abc_MaxInt(p->nCallsMax,p->pMSat->nSolverCalls);
      p->nCallsMax = iVar2;
      Ssw_SatStop(p->pMSat);
      p->pMSat = (Ssw_Sat_t *)0x0;
      Ssw_ManCleanup(p);
      if (clk._4_4_ == 0) goto LAB_007fdf98;
      if (p->pPars->pFunc != (void *)0x0) {
        (*(code *)p->pPars->pFunc)();
      }
    }
    Abc_Print(1,"Stopped signal correspondence after %d refiment iterations.\n",(ulong)(uint)clk);
  }
LAB_007fdf98:
  p->pPars->nIters = (uint)clk + 1;
  aVar11 = Abc_Clock();
  p->timeTotal = aVar11 - aVar7;
  Ssw_ManUpdateEquivs(p,p->pAig,p->pPars->fVerbose);
  pAVar12 = Aig_ManDupRepr(p->pAig,0);
  Aig_ManSeqCleanup(pAVar12);
  iVar2 = Ssw_ClassesLitNum(p->ppClasses);
  p->nLitsEnd = iVar2;
  iVar2 = Aig_ManNodeNum(pAVar12);
  p->nNodesEnd = iVar2;
  iVar2 = Aig_ManRegNum(pAVar12);
  p->nRegsEnd = iVar2;
  Aig_ManSetPhase(p->pAig);
  Aig_ManCleanMarkB(p->pAig);
  return pAVar12;
}

Assistant:

Aig_Man_t * Ssw_SignalCorrespondenceRefine( Ssw_Man_t * p )
{
    int nSatProof, nSatCallsSat, nRecycles, nSatFailsReal, nUniques;
    Aig_Man_t * pAigNew;
    int RetValue, nIter = -1;
    abctime clk, clkTotal = Abc_Clock();
    // get the starting stats
    p->nLitsBeg  = Ssw_ClassesLitNum( p->ppClasses );
    p->nNodesBeg = Aig_ManNodeNum(p->pAig);
    p->nRegsBeg  = Aig_ManRegNum(p->pAig);
    // refine classes using BMC
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Before BMC: " );
        Ssw_ClassesPrint( p->ppClasses, 0 );
    }
    if ( !p->pPars->fLatchCorr )
    {
        p->pMSat = Ssw_SatStart( 0 );
        if ( p->pPars->fConstrs )
            Ssw_ManSweepBmcConstr( p );
        else
            Ssw_ManSweepBmc( p );
        Ssw_SatStop( p->pMSat );
        p->pMSat = NULL;
        Ssw_ManCleanup( p );
    }
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "After  BMC: " );
        Ssw_ClassesPrint( p->ppClasses, 0 );
    }
    // apply semi-formal filtering
/*
    if ( p->pPars->fSemiFormal )
    {
        Aig_Man_t * pSRed;
        Ssw_FilterUsingSemi( p, 0, 2000, p->pPars->fVerbose );
//        Ssw_FilterUsingSemi( p, 1, 100000, p->pPars->fVerbose );
        pSRed = Ssw_SpeculativeReduction( p );
        Aig_ManDumpBlif( pSRed, "srm.blif", NULL, NULL );
        Aig_ManStop( pSRed );
    }
*/
    if ( p->pPars->pFunc )
    {
        ((int (*)(void *))p->pPars->pFunc)( p->pPars->pData );
        ((int (*)(void *))p->pPars->pFunc)( p->pPars->pData );
    }
    if ( p->pPars->nStepsMax == 0 )
    {
        Abc_Print( 1, "Stopped signal correspondence after BMC.\n" );
        goto finalize;
    }
    // refine classes using induction
    nSatProof = nSatCallsSat = nRecycles = nSatFailsReal = nUniques = 0;
    for ( nIter = 0; ; nIter++ )
    {
        if ( p->pPars->nStepsMax == nIter )
        {
            Abc_Print( 1, "Stopped signal correspondence after %d refiment iterations.\n", nIter );
            goto finalize;
        }
        if ( p->pPars->nItersStop >= 0 && p->pPars->nItersStop == nIter )
        {
            Aig_Man_t * pSRed = Ssw_SpeculativeReduction( p );
            Aig_ManDumpBlif( pSRed, "srm.blif", NULL, NULL );
            Aig_ManStop( pSRed );
            Abc_Print( 1, "Iterative refinement is stopped before iteration %d.\n", nIter );
            Abc_Print( 1, "The network is reduced using candidate equivalences.\n" );
            Abc_Print( 1, "Speculatively reduced miter is saved in file \"%s\".\n", "srm.blif" );
            Abc_Print( 1, "If the miter is SAT, the reduced result is incorrect.\n" );
            break;
        }

clk = Abc_Clock();
        p->pMSat = Ssw_SatStart( 0 );
        if ( p->pPars->fLatchCorrOpt )
        {
            RetValue = Ssw_ManSweepLatch( p );
            if ( p->pPars->fVerbose )
            {
                Abc_Print( 1, "%3d : C =%7d. Cl =%7d. Pr =%6d. Cex =%5d. R =%4d. F =%4d. ",
                    nIter, Ssw_ClassesCand1Num(p->ppClasses), Ssw_ClassesClassNum(p->ppClasses),
                    p->nSatProof-nSatProof, p->nSatCallsSat-nSatCallsSat,
                    p->nRecycles-nRecycles, p->nSatFailsReal-nSatFailsReal );
                ABC_PRT( "T", Abc_Clock() - clk );
            }
        }
        else
        {
            if ( p->pPars->fConstrs )
                RetValue = Ssw_ManSweepConstr( p );
            else if ( p->pPars->fDynamic )
                RetValue = Ssw_ManSweepDyn( p );
            else
                RetValue = Ssw_ManSweep( p );

            p->pPars->nConflicts += p->pMSat->pSat->stats.conflicts;
            if ( p->pPars->fVerbose )
            {
                Abc_Print( 1, "%3d : C =%7d. Cl =%7d. LR =%6d. NR =%6d. ",
                    nIter, Ssw_ClassesCand1Num(p->ppClasses), Ssw_ClassesClassNum(p->ppClasses),
                    p->nConstrReduced, Aig_ManNodeNum(p->pFrames) );
                if ( p->pPars->fDynamic )
                {
                    Abc_Print( 1, "Cex =%5d. ", p->nSatCallsSat-nSatCallsSat );
                    Abc_Print( 1, "R =%4d. ",   p->nRecycles-nRecycles );
                }
                Abc_Print( 1, "F =%5d. %s ", p->nSatFailsReal-nSatFailsReal,
                    (Saig_ManPoNum(p->pAig)==1 && Ssw_ObjIsConst1Cand(p->pAig,Aig_ObjFanin0(Aig_ManCo(p->pAig,0))))? "+" : "-" );
                ABC_PRT( "T", Abc_Clock() - clk );
            }
//            if ( p->pPars->fDynamic && p->nSatCallsSat-nSatCallsSat < 100 )
//                p->pPars->nBTLimit = 10000;

            if ( p->pPars->fStopWhenGone && Saig_ManPoNum(p->pAig) == 1 && !Ssw_ObjIsConst1Cand(p->pAig,Aig_ObjFanin0(Aig_ManCo(p->pAig,0))) )
            {
                printf( "Iterative refinement is stopped after iteration %d\n", nIter );
                printf( "because the property output is no longer a candidate constant.\n" );
                // prepare to quite
                p->nLitsEnd  = p->nLitsBeg;
                p->nNodesEnd = p->nNodesBeg;
                p->nRegsEnd  = p->nRegsBeg;
                // cleanup
                Ssw_SatStop( p->pMSat );
                p->pMSat = NULL;
                Ssw_ManCleanup( p );
                // cleanup
                Aig_ManSetPhase( p->pAig );
                Aig_ManCleanMarkB( p->pAig );
                return Aig_ManDupSimple( p->pAig );
            }
        }
        nSatProof     = p->nSatProof;
        nSatCallsSat  = p->nSatCallsSat;
        nRecycles     = p->nRecycles;
        nSatFailsReal = p->nSatFailsReal;
        nUniques      = p->nUniques;

        p->nVarsMax  = Abc_MaxInt( p->nVarsMax,  p->pMSat->nSatVars );
        p->nCallsMax = Abc_MaxInt( p->nCallsMax, p->pMSat->nSolverCalls );
        Ssw_SatStop( p->pMSat );
        p->pMSat = NULL;
        Ssw_ManCleanup( p );
        if ( !RetValue )
            break;
        if ( p->pPars->pFunc )
            ((int (*)(void *))p->pPars->pFunc)( p->pPars->pData );
    }

finalize:
    p->pPars->nIters = nIter + 1;
p->timeTotal = Abc_Clock() - clkTotal;

    Ssw_ManUpdateEquivs( p, p->pAig, p->pPars->fVerbose );
    pAigNew = Aig_ManDupRepr( p->pAig, 0 );
    Aig_ManSeqCleanup( pAigNew );
//Ssw_ClassesPrint( p->ppClasses, 1 );
    // get the final stats
    p->nLitsEnd  = Ssw_ClassesLitNum( p->ppClasses );
    p->nNodesEnd = Aig_ManNodeNum(pAigNew);
    p->nRegsEnd  = Aig_ManRegNum(pAigNew);
    // cleanup
    Aig_ManSetPhase( p->pAig );
    Aig_ManCleanMarkB( p->pAig );
    return pAigNew;
}